

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

XMLElement * __thiscall tinyxml2::XMLNode::PreviousSiblingElement(XMLNode *this,char *name)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar4;
  XMLElement *pXVar5;
  long lVar6;
  XMLElement *unaff_R12;
  bool bVar7;
  bool bVar8;
  XMLElement *pXVar3;
  
  do {
    this = this->_prev;
    if (this == (XMLNode *)0x0) {
      return (XMLElement *)0x0;
    }
    iVar2 = (*this->_vptr_XMLNode[6])(this);
    pXVar3 = (XMLElement *)CONCAT44(extraout_var,iVar2);
    bVar7 = pXVar3 == (XMLElement *)0x0;
    pXVar5 = pXVar3;
    if (bVar7) {
      pXVar5 = unaff_R12;
    }
    if (name != (char *)0x0 && !bVar7) {
      iVar2 = (*(pXVar3->super_XMLNode)._vptr_XMLNode[9])(pXVar3);
      if (CONCAT44(extraout_var_00,iVar2) == 0) {
        pcVar4 = StrPair::GetStr(&(pXVar3->super_XMLNode)._value);
      }
      else {
        pcVar4 = (char *)0x0;
      }
      if (pcVar4 != name) {
        bVar7 = *name == '\0';
        if ((bVar7) || (*name != *pcVar4)) {
          bVar8 = false;
        }
        else {
          lVar1 = 1;
          do {
            lVar6 = lVar1;
            bVar7 = name[lVar6] == '\0';
            if ((bVar7) || (name[lVar6] != pcVar4[lVar6])) break;
            lVar1 = lVar6 + 1;
          } while ((int)lVar6 != 0x7fffffff);
          bVar8 = (int)lVar6 == 0x7fffffff;
          pcVar4 = pcVar4 + lVar6;
        }
        if ((!bVar8) && ((!bVar7 || (*pcVar4 != '\0')))) {
          bVar7 = true;
          pXVar5 = unaff_R12;
          goto LAB_001bbd4e;
        }
      }
      bVar7 = false;
      pXVar5 = pXVar3;
    }
LAB_001bbd4e:
    unaff_R12 = pXVar5;
    if (!bVar7) {
      return pXVar5;
    }
  } while( true );
}

Assistant:

const XMLElement* XMLNode::PreviousSiblingElement( const char* name ) const
{
    for( const XMLNode* node = _prev; node; node = node->_prev ) {
        const XMLElement* element = node->ToElement();
        if ( element
                && (!name || XMLUtil::StringEqual( name, element->Name() ))) {
            return element;
        }
    }
    return 0;
}